

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portmidi.c
# Opt level: O0

PmError Pm_OpenInput(PortMidiStream **stream,PmDeviceID inputDevice,void *inputDriverInfo,
                    int32_t bufferSize,PmTimeProcPtr time_proc,void *time_info)

{
  PmDeviceID *ptr;
  PmQueue *pPVar1;
  PmError local_44;
  PmError err;
  PmInternal *midi;
  void *time_info_local;
  PmTimeProcPtr time_proc_local;
  int32_t bufferSize_local;
  void *inputDriverInfo_local;
  PmDeviceID inputDevice_local;
  PortMidiStream **stream_local;
  
  local_44 = pmNoData;
  pm_hosterror = 0;
  *stream = (PortMidiStream *)0x0;
  if ((inputDevice < 0) || (pm_descriptor_index <= inputDevice)) {
    local_44 = pmInvalidDeviceId;
  }
  else if (descriptors[inputDevice].pub.input == 0) {
    local_44 = pmInvalidDeviceId;
  }
  else if (descriptors[inputDevice].pub.opened != 0) {
    local_44 = pmInvalidDeviceId;
  }
  if (local_44 == pmNoData) {
    ptr = (PmDeviceID *)pm_alloc(0x78);
    *stream = ptr;
    if (ptr == (PmDeviceID *)0x0) {
      local_44 = pmInsufficientMemory;
    }
    else {
      *ptr = inputDevice;
      *(undefined2 *)(ptr + 1) = 0;
      *(PmTimeProcPtr *)(ptr + 2) = time_proc;
      *(void **)(ptr + 4) = time_info;
      time_proc_local._4_4_ = bufferSize;
      if (bufferSize < 1) {
        time_proc_local._4_4_ = 0x100;
      }
      pPVar1 = Pm_QueueCreate((long)time_proc_local._4_4_,8);
      *(PmQueue **)(ptr + 8) = pPVar1;
      if (*(long *)(ptr + 8) == 0) {
        *stream = (PortMidiStream *)0x0;
        pm_free(ptr);
        local_44 = pmInsufficientMemory;
      }
      else {
        ptr[6] = time_proc_local._4_4_;
        ptr[10] = 0;
        ptr[0xb] = 0;
        ptr[0xc] = 0;
        ptr[0xd] = 0;
        ptr[0xe] = 0x4000;
        ptr[0xf] = 0xffff;
        ptr[0x11] = 0;
        ptr[0x13] = 1;
        *(pm_fns_type *)(ptr + 0x14) = descriptors[inputDevice].dictionary;
        ptr[0x18] = 0;
        ptr[0x19] = 0;
        ptr[0x1a] = 0;
        ptr[0x1b] = 0;
        ptr[0x1c] = 0;
        descriptors[inputDevice].internalDescriptor = ptr;
        local_44 = (**(code **)(*(long *)(ptr + 0x14) + 0x38))(ptr,inputDriverInfo);
        if (local_44 == pmNoData) {
          descriptors[inputDevice].pub.opened = 1;
        }
        else {
          *stream = (PortMidiStream *)0x0;
          descriptors[inputDevice].internalDescriptor = (void *)0x0;
          Pm_QueueDestroy(*(PmQueue **)(ptr + 8));
          pm_free(ptr);
        }
      }
    }
  }
  return local_44;
}

Assistant:

PMEXPORT PmError Pm_OpenInput(PortMidiStream** stream,
                     PmDeviceID inputDevice,
                     void *inputDriverInfo,
                     int32_t bufferSize,
                     PmTimeProcPtr time_proc,
                     void *time_info)
{
    PmInternal *midi;
    PmError err = pmNoError;
    pm_hosterror = FALSE;
    *stream = NULL;
    
    /* arg checking */
    if (inputDevice < 0 || inputDevice >= pm_descriptor_index) 
        err = pmInvalidDeviceId;
    else if (!descriptors[inputDevice].pub.input) 
        err =  pmInvalidDeviceId;
    else if(descriptors[inputDevice].pub.opened)
        err =  pmInvalidDeviceId;
    
    if (err != pmNoError) 
        goto error_return;

    /* create portMidi internal data */
    midi = (PmInternal *) pm_alloc(sizeof(PmInternal)); 
    *stream = midi;
    if (!midi) {
        err = pmInsufficientMemory;
        goto error_return;
    }
    midi->device_id = inputDevice;
    midi->write_flag = FALSE;
    midi->time_proc = time_proc;
    midi->time_info = time_info;
    /* windows adds timestamps in the driver and these are more accurate than
       using a time_proc, so do not automatically provide a time proc. Non-win
       implementations may want to provide a default time_proc in their
       system-specific midi_out_open() method.
     */
    if (bufferSize <= 0) bufferSize = 256; /* default buffer size */
    midi->queue = Pm_QueueCreate(bufferSize, (int32_t) sizeof(PmEvent));
    if (!midi->queue) {
        /* free portMidi data */
        *stream = NULL;
        pm_free(midi); 
        err = pmInsufficientMemory;
        goto error_return;
    }
    midi->buffer_len = bufferSize; /* portMidi input storage */
    midi->latency = 0; /* not used */
    midi->sysex_in_progress = FALSE;
    midi->sysex_message = 0; 
    midi->sysex_message_count = 0; 
    midi->filters = PM_FILT_ACTIVE;
    midi->channel_mask = 0xFFFF;
    midi->sync_time = 0;
    midi->first_message = TRUE;
    midi->dictionary = descriptors[inputDevice].dictionary;
    midi->fill_base = NULL;
    midi->fill_offset_ptr = NULL;
    midi->fill_length = 0;
    descriptors[inputDevice].internalDescriptor = midi;
    /* open system dependent input device */
    err = (*midi->dictionary->open)(midi, inputDriverInfo);
    if (err) {
        *stream = NULL;
        descriptors[inputDevice].internalDescriptor = NULL;
        /* free portMidi data */
        Pm_QueueDestroy(midi->queue);
        pm_free(midi);
    } else {
        /* portMidi input open successful */
        descriptors[inputDevice].pub.opened = TRUE;
    }
error_return:
    /* note: if there is a pmHostError, it is the responsibility
     * of the system-dependent code (*midi->dictionary->open)()
     * to set pm_hosterror and pm_hosterror_text
     */
    return pm_errmsg(err);
}